

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *
Catch::filterTests(vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *__return_storage_ptr__
                  ,vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *testCases,
                  TestSpec *testSpec,IConfig *config)

{
  pointer pTVar1;
  bool bVar2;
  int iVar3;
  TestCase *testCase;
  pointer __x;
  
  (__return_storage_ptr__->super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  clara::std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::reserve
            (__return_storage_ptr__,
             ((long)(testCases->
                    super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>)._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(testCases->
                    super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>)._M_impl.
                    super__Vector_impl_data._M_start >> 3) * -0x2c8590b21642c859);
  __x = (testCases->super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>)._M_impl.
        super__Vector_impl_data._M_start;
  pTVar1 = (testCases->super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  do {
    if (__x == pTVar1) {
      return __return_storage_ptr__;
    }
    if ((testSpec->m_filters).
        super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>.
        _M_impl.super__Vector_impl_data._M_start ==
        (testSpec->m_filters).
        super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      if (((__x->super_TestCaseInfo).properties & IsHidden) == None) goto LAB_0011e5bb;
    }
    else {
      bVar2 = TestSpec::matches(testSpec,&__x->super_TestCaseInfo);
      if ((bVar2) &&
         ((((__x->super_TestCaseInfo).properties & Throws) == None ||
          (iVar3 = (*(config->super_NonCopyable)._vptr_NonCopyable[2])(config), (char)iVar3 != '\0')
          ))) {
LAB_0011e5bb:
        clara::std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::push_back
                  (__return_storage_ptr__,__x);
      }
    }
    __x = __x + 1;
  } while( true );
}

Assistant:

std::vector<TestCase> filterTests( std::vector<TestCase> const& testCases, TestSpec const& testSpec, IConfig const& config ) {
        std::vector<TestCase> filtered;
        filtered.reserve( testCases.size() );
        for (auto const& testCase : testCases) {
            if ((!testSpec.hasFilters() && !testCase.isHidden()) ||
                (testSpec.hasFilters() && matchTest(testCase, testSpec, config))) {
                filtered.push_back(testCase);
            }
        }
        return filtered;
    }